

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O0

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  Einsum_final *in_RDI;
  
  ~Einsum_final(in_RDI);
  operator_delete(in_RDI,0x110);
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }